

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

UnicodeString *
icu_63::MessageImpl::appendSubMessageWithoutSkipSyntax
          (MessagePattern *msgPattern,int32_t msgStart,UnicodeString *result)

{
  UnicodeString *src;
  UMessagePatternPartType UVar1;
  int start;
  Part *pPVar2;
  int32_t i;
  int srcStart;
  long lVar3;
  UnicodeString *local_38;
  
  src = &msgPattern->msg;
  srcStart = (uint)msgPattern->parts[msgStart].length + msgPattern->parts[msgStart].index;
  do {
    lVar3 = (long)msgStart;
    msgStart = msgStart + 1;
    lVar3 = lVar3 + 1;
    pPVar2 = msgPattern->parts;
    UVar1 = pPVar2[lVar3].type;
    start = pPVar2[lVar3].index;
    if (UVar1 == UMSGPAT_PART_TYPE_MSG_LIMIT) {
      local_38 = UnicodeString::doAppend(result,src,srcStart,start - srcStart);
    }
    else if (UVar1 == UMSGPAT_PART_TYPE_ARG_START) {
      UnicodeString::doAppend(result,src,srcStart,start - srcStart);
      pPVar2 = msgPattern->parts;
      if (msgStart < pPVar2[lVar3].limitPartIndex) {
        msgStart = pPVar2[lVar3].limitPartIndex;
      }
      srcStart = (uint)pPVar2[msgStart].length + pPVar2[msgStart].index;
      appendReducedApostrophes(src,start,srcStart,result);
    }
    else if (UVar1 == UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
      UnicodeString::doAppend(result,src,srcStart,start - srcStart);
      srcStart = (uint)pPVar2[lVar3].length + pPVar2[lVar3].index;
    }
  } while (UVar1 != UMSGPAT_PART_TYPE_MSG_LIMIT);
  return local_38;
}

Assistant:

UnicodeString &
MessageImpl::appendSubMessageWithoutSkipSyntax(const MessagePattern &msgPattern,
                                               int32_t msgStart,
                                               UnicodeString &result) {
    const UnicodeString &msgString=msgPattern.getPatternString();
    int32_t prevIndex=msgPattern.getPart(msgStart).getLimit();
    for(int32_t i=msgStart;;) {
        const MessagePattern::Part &part=msgPattern.getPart(++i);
        UMessagePatternPartType type=part.getType();
        int32_t index=part.getIndex();
        if(type==UMSGPAT_PART_TYPE_MSG_LIMIT) {
            return result.append(msgString, prevIndex, index-prevIndex);
        } else if(type==UMSGPAT_PART_TYPE_SKIP_SYNTAX) {
            result.append(msgString, prevIndex, index-prevIndex);
            prevIndex=part.getLimit();
        } else if(type==UMSGPAT_PART_TYPE_ARG_START) {
            result.append(msgString, prevIndex, index-prevIndex);
            prevIndex=index;
            i=msgPattern.getLimitPartIndex(i);
            index=msgPattern.getPart(i).getLimit();
            appendReducedApostrophes(msgString, prevIndex, index, result);
            prevIndex=index;
        }
    }
}